

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

czstring pstore::basic_logger::priority_string(priority p)

{
  if (p < 8) {
    return &DAT_00173b68 + *(int *)(&DAT_00173b68 + (ulong)p * 4);
  }
  assert_failed("0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/logging.cpp"
                ,0x179);
}

Assistant:

gsl::czstring basic_logger::priority_string (priority const p) noexcept {
            switch (p) {
            case priority::emergency: return "emergency";
            case priority::alert: return "alert";
            case priority::critical: return "critical";
            case priority::error: return "error";
            case priority::warning: return "warning";
            case priority::notice: return "notice";
            case priority::info: return "info";
            case priority::debug: return "debug";
            }
            PSTORE_ASSERT (0);
            return "emergency";
        }